

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O2

bool __thiscall cmQtAutoGeneratorMocUic::JobUicT::UpdateRequired(JobUicT *this,WorkerT *wrk)

{
  string *filename;
  uint uVar1;
  bool bVar2;
  string reason;
  string local_48;
  
  uVar1 = (wrk->Gen_->super_cmQtAutoGenerator).Logger_.Verbosity_;
  filename = &this->BuildFile;
  bVar2 = cmQtAutoGenerator::FileSystem::FileExists
                    (&(wrk->Gen_->super_cmQtAutoGenerator).FileSys_,filename);
  if (bVar2) {
    if ((wrk->Gen_->Uic_).SettingsChanged == true) {
      if (uVar1 == 0) {
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reason,"Generating ",(allocator<char> *)&local_48);
      cmQtAutoGen::Quoted(&local_48,filename);
      std::__cxx11::string::append((string *)&reason);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::append((char *)&reason);
      cmQtAutoGen::Quoted(&local_48,&this->SourceFile);
      std::__cxx11::string::append((string *)&reason);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::append((char *)&reason);
      WorkerT::LogInfo(wrk,UIC,&reason);
    }
    else {
      reason._M_dataplus._M_p = (pointer)&reason.field_2;
      reason._M_string_length = 0;
      reason.field_2._M_local_buf[0] = '\0';
      bVar2 = cmQtAutoGenerator::FileSystem::FileIsOlderThan
                        (&(wrk->Gen_->super_cmQtAutoGenerator).FileSys_,filename,&this->SourceFile,
                         &reason);
      if (!bVar2) {
        if (reason._M_string_length != 0) {
          WorkerT::LogError(wrk,UIC,&reason);
        }
        std::__cxx11::string::~string((string *)&reason);
        return false;
      }
      std::__cxx11::string::~string((string *)&reason);
      if (uVar1 == 0) {
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reason,"Generating ",(allocator<char> *)&local_48);
      cmQtAutoGen::Quoted(&local_48,filename);
      std::__cxx11::string::append((string *)&reason);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::append((char *)&reason);
      cmQtAutoGen::Quoted(&local_48,&this->SourceFile);
      std::__cxx11::string::append((string *)&reason);
      std::__cxx11::string::~string((string *)&local_48);
      WorkerT::LogInfo(wrk,UIC,&reason);
    }
  }
  else {
    if (uVar1 == 0) {
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reason,"Generating ",(allocator<char> *)&local_48);
    cmQtAutoGen::Quoted(&local_48,filename);
    std::__cxx11::string::append((string *)&reason);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::append((char *)&reason);
    cmQtAutoGen::Quoted(&local_48,&this->SourceFile);
    std::__cxx11::string::append((string *)&reason);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::append((char *)&reason);
    WorkerT::LogInfo(wrk,UIC,&reason);
  }
  std::__cxx11::string::~string((string *)&reason);
  return true;
}

Assistant:

bool cmQtAutoGeneratorMocUic::JobUicT::UpdateRequired(WorkerT& wrk)
{
  bool const verbose = wrk.Gen().Log().Verbose();

  // Test if the build file exists
  if (!wrk.FileSys().FileExists(BuildFile)) {
    if (verbose) {
      std::string reason = "Generating ";
      reason += Quoted(BuildFile);
      reason += " from its source file ";
      reason += Quoted(SourceFile);
      reason += " because it doesn't exist";
      wrk.LogInfo(GenT::UIC, reason);
    }
    return true;
  }

  // Test if the uic settings changed
  if (wrk.Uic().SettingsChanged) {
    if (verbose) {
      std::string reason = "Generating ";
      reason += Quoted(BuildFile);
      reason += " from ";
      reason += Quoted(SourceFile);
      reason += " because the UIC settings changed";
      wrk.LogInfo(GenT::UIC, reason);
    }
    return true;
  }

  // Test if the source file is newer
  {
    bool isOlder = false;
    {
      std::string error;
      isOlder = wrk.FileSys().FileIsOlderThan(BuildFile, SourceFile, &error);
      if (!isOlder && !error.empty()) {
        wrk.LogError(GenT::UIC, error);
        return false;
      }
    }
    if (isOlder) {
      if (verbose) {
        std::string reason = "Generating ";
        reason += Quoted(BuildFile);
        reason += " because it's older than its source file ";
        reason += Quoted(SourceFile);
        wrk.LogInfo(GenT::UIC, reason);
      }
      return true;
    }
  }

  return false;
}